

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::CompilerGLSL::
statement_inner<GLSLstd450_const&,char_const(&)[3],char_const*&,char_const(&)[2],char_const*&,char_const(&)[2],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3]>
          (CompilerGLSL *this,GLSLstd450 *t,char (*ts) [3],char **ts_1,char (*ts_2) [2],char **ts_3,
          char (*ts_4) [2],char **ts_5,char (*ts_6) [3],char **ts_7,char (*ts_8) [3],char **ts_9,
          char (*ts_10) [3])

{
  StringStream<4096UL,_4096UL> *this_00;
  char *pcVar1;
  size_t sVar2;
  
  this_00 = &this->buffer;
  StringStream<4096UL,_4096UL>::operator<<<GLSLstd450,_0>(this_00,t);
  this->statement_count = this->statement_count + 1;
  sVar2 = strlen(*ts);
  StringStream<4096UL,_4096UL>::append(this_00,*ts,sVar2);
  this->statement_count = this->statement_count + 1;
  pcVar1 = *ts_1;
  sVar2 = strlen(pcVar1);
  StringStream<4096UL,_4096UL>::append(this_00,pcVar1,sVar2);
  this->statement_count = this->statement_count + 1;
  sVar2 = strlen(*ts_2);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_2,sVar2);
  this->statement_count = this->statement_count + 1;
  pcVar1 = *ts_3;
  sVar2 = strlen(pcVar1);
  StringStream<4096UL,_4096UL>::append(this_00,pcVar1,sVar2);
  this->statement_count = this->statement_count + 1;
  sVar2 = strlen(*ts_4);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_4,sVar2);
  this->statement_count = this->statement_count + 1;
  statement_inner<char_const*&,char_const(&)[3],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3]>
            (this,ts_5,ts_6,ts_7,ts_8,ts_9,ts_10);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}